

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<diy::Point<float,3u>,fmt::v7::detail::fallback_formatter<diy::Point<float,3u>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  buffer_appender<char> bVar4;
  fallback_formatter<diy::Point<float,_3U>,_char,_void> f;
  dynamic_format_specs<char> local_60;
  
  dynamic_format_specs<char>::dynamic_format_specs(&local_60);
  pcVar3 = formatter<fmt::v7::basic_string_view<char>,char,void>::
           parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                     ((formatter<fmt::v7::basic_string_view<char>,char,void> *)&local_60,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  (parse_ctx->format_str_).data_ = pcVar3;
  psVar1 = &(parse_ctx->format_str_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  bVar4 = fallback_formatter<diy::Point<float,3u>,char,void>::
          format<fmt::v7::detail::buffer_appender<char>>
                    ((fallback_formatter<diy::Point<float,3u>,char,void> *)&local_60,
                     (Point<float,_3U> *)arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }